

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indexer.cpp
# Opt level: O0

void build_dindex_recursive<IsoHPlane>
               (size_t curr_node,size_t n_terminal,size_t ncomb,size_t st,size_t end,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *node_indices,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *node_mappings,
               vector<double,_std::allocator<double>_> *node_distances,
               vector<double,_std::allocator<double>_> *node_depths,size_t curr_depth,
               vector<IsoHPlane,_std::allocator<IsoHPlane>_> *tree)

{
  value_type vVar1;
  size_type sVar2;
  value_type vVar3;
  bool bVar4;
  reference pvVar5;
  const_reference pvVar6;
  reference pvVar7;
  const_reference pvVar8;
  runtime_error *this;
  ulong in_RCX;
  size_t in_RDX;
  size_t in_RSI;
  size_type in_RDI;
  ulong in_R8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_R9;
  double dVar9;
  undefined1 auVar10 [16];
  vector<unsigned_long,_std::allocator<unsigned_long>_> *unaff_retaddr;
  vector<double,_std::allocator<double>_> *in_stack_00000008;
  vector<double,_std::allocator<double>_> *in_stack_00000010;
  vector<double,_std::allocator<double>_> *in_stack_00000018;
  long in_stack_00000020;
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *in_stack_00000028;
  size_t ix;
  size_t temp;
  size_t frontier;
  size_t delim;
  size_t el2;
  size_t el1;
  size_t j;
  size_t i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  int __val;
  size_type local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c9 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_181;
  undefined1 local_159 [185];
  string local_a0 [32];
  ulong local_80;
  value_type local_78;
  ulong local_70;
  size_t local_68;
  ulong local_60;
  ulong local_58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffb8;
  ulong uVar11;
  
  uVar11 = in_RCX;
  if (in_RCX < in_R8) {
    while (local_58 = uVar11, sVar2 = local_58, local_58 < in_R8) {
      while (local_60 = sVar2 + 1, local_60 <= in_R8) {
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (in_R9,local_58);
        pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            in_stack_00000008,*pvVar5);
        in_stack_ffffffffffffffb8 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)*pvVar6
        ;
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (in_R9,local_60);
        pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            in_stack_00000008,*pvVar5);
        local_50 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)*pvVar6;
        if (in_stack_ffffffffffffffb8 < local_50) {
          local_1f0 = (long)local_50 +
                      (((in_RDX - (long)in_stack_ffffffffffffffb8) + -1) -
                      ((in_RSI - (long)in_stack_ffffffffffffffb8) *
                       ((in_RSI - (long)in_stack_ffffffffffffffb8) + -1) >> 1));
        }
        else {
          local_1f0 = (long)in_stack_ffffffffffffffb8 +
                      (((in_RDX - (long)local_50) + -1) -
                      ((in_RSI - (long)local_50) * ((in_RSI - (long)local_50) + -1) >> 1));
        }
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (in_stack_00000010,local_1f0);
        *pvVar7 = *pvVar7 + 1.0;
        sVar2 = local_60;
      }
      uVar11 = local_58 + 1;
    }
  }
  pvVar8 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_stack_00000028,in_RDI);
  bVar4 = is_terminal_node(pvVar8);
  if (bVar4) {
    auVar10._8_4_ = (int)((ulong)in_stack_00000020 >> 0x20);
    auVar10._0_8_ = in_stack_00000020;
    auVar10._12_4_ = 0x45300000;
    dVar9 = (auVar10._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)in_stack_00000020) - 4503599627370496.0);
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_00000008,
                        in_RDI);
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_00000018,*pvVar6);
    *pvVar7 = dVar9;
  }
  else {
    pvVar8 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                       (in_stack_00000028,in_RDI);
    local_80 = in_RCX;
    local_68 = get_idx_tree_right(pvVar8);
    local_70 = local_80;
    uVar11 = local_80;
    for (; local_80 <= in_R8; local_80 = local_80 + 1) {
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_R9,local_80);
      if (*pvVar5 < local_68) {
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (in_R9,local_70);
        local_78 = *pvVar5;
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (in_R9,local_80);
        vVar1 = *pvVar5;
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (in_R9,local_70);
        vVar3 = local_78;
        *pvVar5 = vVar1;
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (in_R9,local_80);
        *pvVar5 = vVar3;
        local_70 = local_70 + 1;
      }
    }
    if (local_70 == uVar11) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffde0,(char *)in_stack_fffffffffffffdd8,
                 (allocator<char> *)in_stack_fffffffffffffdd0);
      __val = (int)((ulong)local_159 >> 0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffde0,(char *)in_stack_fffffffffffffdd8,
                 (allocator<char> *)in_stack_fffffffffffffdd0);
      std::operator+(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
      this_00 = &local_181;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,(char *)in_stack_fffffffffffffdd8,
                 (allocator<char> *)in_stack_fffffffffffffdd0);
      std::operator+(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
      std::__cxx11::to_string(__val);
      std::operator+(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
      __lhs = local_1c9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,(char *)__lhs,(allocator<char> *)in_stack_fffffffffffffdd0);
      std::operator+(__lhs,in_stack_fffffffffffffdd0);
      std::runtime_error::runtime_error(this,local_a0);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pvVar8 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                       (in_stack_00000028,in_RDI);
    get_idx_tree_left(pvVar8);
    build_dindex_recursive<IsoHPlane>
              (in_RSI,in_RDX,uVar11,in_R8,(size_t)in_R9,in_stack_ffffffffffffffb8,unaff_retaddr,
               in_stack_00000008,in_stack_00000010,(size_t)in_stack_00000018,
               (vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)(in_stack_00000020 + 1));
    pvVar8 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                       (in_stack_00000028,in_RDI);
    get_idx_tree_right(pvVar8);
    build_dindex_recursive<IsoHPlane>
              (in_RSI,in_RDX,uVar11,in_R8,(size_t)in_R9,in_stack_ffffffffffffffb8,unaff_retaddr,
               in_stack_00000008,in_stack_00000010,(size_t)in_stack_00000018,
               (vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)(in_stack_00000020 + 1));
  }
  return;
}

Assistant:

void build_dindex_recursive
(
    const size_t curr_node,
    const size_t n_terminal, const size_t ncomb,
    const size_t st, const size_t end,
    std::vector<size_t> &restrict node_indices, /* array with all terminal indices in 'tree' */
    const std::vector<size_t> &restrict node_mappings, /* tree_index : terminal_index */
    std::vector<double> &restrict node_distances, /* indexed by terminal_index */
    std::vector<double> &restrict node_depths, /* indexed by terminal_index */
    size_t curr_depth,
    const std::vector<Node> &tree
)
{
    if (end > st)
    {
        size_t i, j;
        for (size_t el1 = st; el1 < end; el1++)
        {
            for (size_t el2 = el1 + 1; el2 <= end; el2++)
            {
                i = node_mappings[node_indices[el1]];
                j = node_mappings[node_indices[el2]];
                node_distances[ix_comb(i, j, n_terminal, ncomb)]++;
            }
        }
    }

    if (!is_terminal_node(tree[curr_node]))
    {
        const size_t delim = get_idx_tree_right(tree[curr_node]);
        size_t frontier = st;
        size_t temp;
        for (size_t ix = st; ix <= end; ix++)
        {
           if (node_indices[ix] < delim)
            {
                temp = node_indices[frontier];
                node_indices[frontier] = node_indices[ix];
                node_indices[ix] = temp;
                frontier++;
            }
        }

        if (unlikely(frontier == st)) unexpected_error();

        curr_depth++;
        build_dindex_recursive<Node>(get_idx_tree_left(tree[curr_node]),
                                     n_terminal, ncomb,
                                     st, frontier-1,
                                     node_indices,
                                     node_mappings,
                                     node_distances,
                                     node_depths,
                                     curr_depth,
                                     tree);
        build_dindex_recursive<Node>(get_idx_tree_right(tree[curr_node]),
                                     n_terminal, ncomb,
                                     frontier, end,
                                     node_indices,
                                     node_mappings,
                                     node_distances,
                                     node_depths,
                                     curr_depth,
                                     tree);
    }

    else
    {
        node_depths[node_mappings[curr_node]] = curr_depth;
    }
}